

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patrol_strategy.cpp
# Opt level: O1

void __thiscall
PatrolStrategy::generateActions(PatrolStrategy *this,PlayerSight *sight,Actions *actions)

{
  Randomizer *pRVar1;
  float fVar2;
  float fVar3;
  Vec2 VVar4;
  
  if (this->field_0xc != '\0') {
    return;
  }
  if (sight->round == 1) {
    pRVar1 = Randomizer::getInstance();
    fVar2 = Randomizer::randXAxis(pRVar1);
    this->currentTarget = (int)fVar2 % 5;
  }
  if (sight->round % 0x28 != 1) {
    return;
  }
  this->currentTarget = this->currentTarget + ((this->currentTarget + 1) / 5) * -5 + 1;
  pRVar1 = Randomizer::getInstance();
  fVar2 = Randomizer::randXAxis(pRVar1);
  pRVar1 = Randomizer::getInstance();
  fVar3 = Randomizer::randYAxis(pRVar1);
  (this->goal).x = (fVar2 * 4.0) / 60.0 + -2.0;
  (this->goal).y = (fVar3 * 4.0) / 90.0 + -2.0;
  switch(this->currentTarget) {
  case 0:
    fVar2 = (this->goal).x + 27.0;
    fVar3 = (this->goal).y + 82.0;
    break;
  case 1:
    fVar2 = (this->goal).x + 16.0;
    fVar3 = (this->goal).y + 46.0;
    break;
  case 2:
    fVar2 = (this->goal).x + 23.0;
    fVar3 = (this->goal).y + 7.0;
    break;
  case 3:
    fVar2 = (this->goal).x + 40.0;
    fVar3 = (this->goal).y + 55.0;
    break;
  case 4:
    fVar2 = (this->goal).x + 55.0;
    fVar3 = (this->goal).y + 84.0;
    break;
  default:
    this->goal = sight->pos;
    goto LAB_00137a7a;
  }
  VVar4.y = fVar3;
  VVar4.x = fVar2;
  this->goal = VVar4;
LAB_00137a7a:
  Actions::emplace(actions,SelectDestination,sight->id,this->goal);
  return;
}

Assistant:

void PatrolStrategy::generateActions(const PlayerSight &sight, Actions *actions)
{
    CHECK_DISABLED

    if (sight.round == 1)
        currentTarget = (int)(Randomizer::getInstance()->randXAxis()) % 5;
    if (sight.round % 40 != 1)
        return;
    currentTarget = (currentTarget + 1) % 5;
    goal = Vec2(Randomizer::getInstance()->randXAxis() * 4 / MapWidth - 2,
                Randomizer::getInstance()->randYAxis() * 4 / MapHeight - 2);
    switch (currentTarget)
    {
        case 0:
            goal = goal + Vec2(27, 82);
            break;
        case 1:
            goal = goal + Vec2(16, 46);
            break;
        case 2:
            goal = goal + Vec2(23, 7);
            break;
        case 3:
            goal = goal + Vec2(40, 55);
            break;
        case 4:
            goal = goal + Vec2(55, 84);
            break;
        default:
            goal = sight.pos;
    }
    actions->emplace(SelectDestination, sight.id, goal);
}